

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityStatePdu.cpp
# Opt level: O0

bool __thiscall DIS::EntityStatePdu::operator==(EntityStatePdu *this,EntityStatePdu *rhs)

{
  bool bVar1;
  size_type sVar2;
  const_reference this_00;
  const_reference rhs_00;
  ulong local_28;
  size_t idx;
  bool ivarsEqual;
  EntityStatePdu *rhs_local;
  EntityStatePdu *this_local;
  
  idx._7_1_ = EntityInformationFamilyPdu::operator==
                        (&this->super_EntityInformationFamilyPdu,
                         &rhs->super_EntityInformationFamilyPdu);
  bVar1 = EntityID::operator==(&this->_entityID,&rhs->_entityID);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  if (this->_forceId != rhs->_forceId) {
    idx._7_1_ = false;
  }
  bVar1 = EntityType::operator==(&this->_entityType,&rhs->_entityType);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = EntityType::operator==(&this->_alternativeEntityType,&rhs->_alternativeEntityType);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = Vector3Float::operator==(&this->_entityLinearVelocity,&rhs->_entityLinearVelocity);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = Vector3Double::operator==(&this->_entityLocation,&rhs->_entityLocation);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = EulerAngles::operator==(&this->_entityOrientation,&rhs->_entityOrientation);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  if (this->_entityAppearance != rhs->_entityAppearance) {
    idx._7_1_ = false;
  }
  bVar1 = DeadReckoningParameters::operator==
                    (&this->_deadReckoningParameters,&rhs->_deadReckoningParameters);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = EntityMarking::operator==(&this->_marking,&rhs->_marking);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  if (this->_capabilities != rhs->_capabilities) {
    idx._7_1_ = false;
  }
  local_28 = 0;
  while( true ) {
    sVar2 = std::vector<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>::size
                      (&this->_variableParameters);
    if (sVar2 <= local_28) break;
    this_00 = std::vector<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>::
              operator[](&this->_variableParameters,local_28);
    rhs_00 = std::vector<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>::
             operator[](&rhs->_variableParameters,local_28);
    bVar1 = VariableParameter::operator==(this_00,rhs_00);
    if (!bVar1) {
      idx._7_1_ = false;
    }
    local_28 = local_28 + 1;
  }
  return idx._7_1_;
}

Assistant:

bool EntityStatePdu::operator ==(const EntityStatePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = EntityInformationFamilyPdu::operator==(rhs);

     if( ! (_entityID == rhs._entityID) ) ivarsEqual = false;
     if( ! (_forceId == rhs._forceId) ) ivarsEqual = false;
     if( ! (_entityType == rhs._entityType) ) ivarsEqual = false;
     if( ! (_alternativeEntityType == rhs._alternativeEntityType) ) ivarsEqual = false;
     if( ! (_entityLinearVelocity == rhs._entityLinearVelocity) ) ivarsEqual = false;
     if( ! (_entityLocation == rhs._entityLocation) ) ivarsEqual = false;
     if( ! (_entityOrientation == rhs._entityOrientation) ) ivarsEqual = false;
     if( ! (_entityAppearance == rhs._entityAppearance) ) ivarsEqual = false;
     if( ! (_deadReckoningParameters == rhs._deadReckoningParameters) ) ivarsEqual = false;
     if( ! (_marking == rhs._marking) ) ivarsEqual = false;
     if( ! (_capabilities == rhs._capabilities) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _variableParameters.size(); idx++)
     {
        if( ! ( _variableParameters[idx] == rhs._variableParameters[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }